

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O3

bool __thiscall
clickhouse::ColumnString::Load(ColumnString *this,CodedInputStream *input,size_t rows)

{
  bool bVar1;
  ulong uVar2;
  bool bVar3;
  string s;
  uint64_t len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  ulong local_38;
  
  if (rows != 0) {
    bVar3 = false;
    uVar2 = 1;
    do {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
      bVar1 = CodedInputStream::ReadVarint64(input,&local_38);
      if ((!bVar1) || (0xffffff < local_38)) {
LAB_001485e7:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p == &local_58.field_2) {
          return bVar3;
        }
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
        return bVar3;
      }
      std::__cxx11::string::resize((ulong)&local_58,(char)local_38);
      bVar1 = CodedInputStream::ReadRaw(input,local_58._M_dataplus._M_p,local_38);
      if (!bVar1) goto LAB_001485e7;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->data_,
                 &local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
      bVar3 = rows <= uVar2;
      bVar1 = uVar2 != rows;
      uVar2 = uVar2 + 1;
    } while (bVar1);
  }
  return true;
}

Assistant:

bool ColumnString::Load(CodedInputStream* input, size_t rows) {
    for (size_t i = 0; i < rows; ++i) {
        std::string s;

        if (!WireFormat::ReadString(input, &s)) {
            return false;
        }

        data_.push_back(std::move(s));
    }

    return true;
}